

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockDataSizeTestCase::iterate
          (InterfaceBlockDataSizeTestCase *this)

{
  Storage SVar1;
  undefined4 uVar2;
  RenderContext *renderCtx;
  TestLog *log;
  Shader *pSVar3;
  pointer __n;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 extraout_var_00;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar9;
  ProgramInterface interface;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Program *pPVar11;
  char *nameWithPath;
  char *description;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long local_300;
  GLint queryDataSize;
  undefined4 uStack_2ec;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockNames;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  GLenum prop;
  undefined4 uStack_27c;
  pointer local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [6];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0 [8];
  ShaderProgram program;
  
  SVar1 = (this->super_InterfaceBlockBaseCase).m_storage;
  interface = (SVar1 != STORAGE_BUFFER) + PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
  pPVar11 = (Program *)&DAT_00000001;
  if (SVar1 != STORAGE_UNIFORM) {
    pPVar11 = (Program *)(ulong)interface;
  }
  uVar2 = *(undefined4 *)
           ((anonymous_namespace)::
            getProgramInterfaceGLEnum(deqp::gles31::Functional::ProgramInterface)::s_enums +
           (long)pPVar11 * 4);
  getProgramInterfaceResourceList_abi_cxx11_
            (&blockNames,(Functional *)(this->super_InterfaceBlockBaseCase).m_program,pPVar11,
             interface);
  renderCtx = ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&prop,(this->super_InterfaceBlockBaseCase).m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&prop);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&prop + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  tcu::TestContext::setTestResult
            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  pPVar11 = (this->super_InterfaceBlockBaseCase).m_program;
  iVar4 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  checkAndLogProgram(&program,pPVar11,(Functions *)CONCAT44(extraout_var,iVar4),
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  if (0 < (int)((ulong)((long)blockNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)blockNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    local_300 = 0;
    do {
      log = ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx)->m_log;
      _prop = (pointer)local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)&prop,"Block","");
      std::operator+(&local_2a0,"Block \"",
                     blockNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_300);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar10) {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e0._8_8_ = plVar8[3];
        _queryDataSize = (pointer)&local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        _queryDataSize = (pointer)*plVar8;
      }
      local_2e8 = plVar8[1];
      *plVar8 = (long)paVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&prop,(string *)&queryDataSize)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_queryDataSize != &local_2e0) {
        operator_delete(_queryDataSize,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_prop != local_270) {
        operator_delete(_prop,(ulong)(local_270[0]._M_allocated_capacity + 1));
      }
      iVar4 = (*((this->super_InterfaceBlockBaseCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      lVar15 = CONCAT44(extraout_var_00,iVar4);
      iVar4 = (**(code **)(lVar15 + 0x9a8))
                        (program.m_program.m_program,uVar2,
                         blockNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_300]._M_dataplus._M_p);
      glu::parseVariableName_abi_cxx11_
                ((string *)&prop,
                 (glu *)blockNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_300]._M_dataplus._M_p,
                 nameWithPath);
      lVar17 = 0;
      for (lVar12 = 0;
          pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                             ((this->super_InterfaceBlockBaseCase).m_program),
          pSVar3 = *(pvVar9->
                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          lVar12 < (int)((ulong)((long)(pSVar3->m_defaultBlock).interfaceBlocks.
                                       super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                *(long *)&(pSVar3->m_defaultBlock).interfaceBlocks.
                                          super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                          ._M_impl.super__Vector_impl_data) >> 4) * 0x38e38e39;
          lVar12 = lVar12 + 1) {
        pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                           ((this->super_InterfaceBlockBaseCase).m_program);
        lVar13 = *(long *)&((*(pvVar9->
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                           interfaceBlocks.
                           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                           ._M_impl.super__Vector_impl_data;
        __n = *(pointer *)(lVar13 + 0x28 + lVar17);
        if ((__n == local_278) &&
           (((__n == (pointer)0x0 ||
             (iVar5 = bcmp(*(void **)(lVar13 + 0x20 + lVar17),_prop,(size_t)__n), iVar5 == 0)) &&
            (pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                                ((this->super_InterfaceBlockBaseCase).m_program),
            *(Storage *)
             (*(long *)&((*(pvVar9->
                           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                           )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                        interfaceBlocks.
                        super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                        ._M_impl.super__Vector_impl_data + 0x14 + lVar17) ==
            (this->super_InterfaceBlockBaseCase).m_storage)))) {
          pvVar9 = ProgramInterfaceDefinition::Program::getShaders
                             ((this->super_InterfaceBlockBaseCase).m_program);
          lVar12 = *(long *)&((*(pvVar9->
                                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_defaultBlock).
                             interfaceBlocks.
                             super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                             ._M_impl.super__Vector_impl_data;
          lVar13 = *(long *)(lVar12 + 0x60 + lVar17);
          if ((int)((ulong)(*(long *)(lVar12 + 0x68 + lVar17) - lVar13) >> 5) * -0x55555555 < 1) {
            iVar5 = 0;
          }
          else {
            lVar14 = 0;
            lVar16 = 0x20;
            iVar5 = 0;
            do {
              iVar7 = getVarTypeSize((VarType *)(lVar13 + lVar16));
              iVar5 = iVar5 + iVar7;
              lVar14 = lVar14 + 1;
              lVar13 = *(long *)(lVar12 + 0x60 + lVar17);
              lVar16 = lVar16 + 0x60;
            } while (lVar14 < (int)((ulong)(*(long *)(lVar12 + 0x68 + lVar17) - lVar13) >> 5) *
                              -0x55555555);
          }
          goto LAB_0053c88b;
        }
        lVar17 = lVar17 + 0x90;
      }
      iVar5 = -1;
LAB_0053c88b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_prop != local_270) {
        operator_delete(_prop,(ulong)(local_270[0]._M_allocated_capacity + 1));
      }
      queryDataSize = 0xffffffff;
      dVar6 = (**(code **)(lVar15 + 0x800))();
      glu::checkError(dVar6,"query resource index",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x835);
      if (iVar4 == -1) {
        _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,
                   "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,
                   blockNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_300]._M_dataplus._M_p,
                   blockNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_300]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\"",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        std::ios_base::~ios_base(local_208);
        description = "Resource not found";
LAB_0053cb15:
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,description);
      }
      else {
        prop = 0x9303;
        (**(code **)(lVar15 + 0x9c8))
                  (program.m_program.m_program,uVar2,iVar4,1,&prop,1,0,&queryDataSize);
        dVar6 = (**(code **)(lVar15 + 0x800))();
        glu::checkError(dVar6,"query resource BUFFER_DATA_SIZE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0x843);
        _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,"BUFFER_DATA_SIZE = ",0x13);
        std::ostream::operator<<((ostringstream *)&local_278,queryDataSize);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,"Buffer data size with tight packing: ",0x25);
        std::ostream::operator<<((ostringstream *)&local_278,iVar5);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        std::ios_base::~ios_base(local_208);
        if (queryDataSize < iVar5) {
          _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_278,
                     "Error, buffer size was less than minimum buffer data size",0x39);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
          std::ios_base::~ios_base(local_208);
          description = "Buffer data size invalid";
          goto LAB_0053cb15;
        }
        _prop = (pointer)((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,"Buffer size valid",0x11);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&prop,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        std::ios_base::~ios_base(local_208);
      }
      tcu::TestLog::endSection(section.m_log);
      local_300 = local_300 + 1;
    } while (local_300 <
             (int)((ulong)((long)blockNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)blockNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&blockNames);
  return STOP;
}

Assistant:

InterfaceBlockDataSizeTestCase::IterateResult InterfaceBlockDataSizeTestCase::iterate (void)
{
	const ProgramInterface			programInterface		= (m_storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
															  (m_storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
															  (PROGRAMINTERFACE_LAST);
	const glw::GLenum				programGLInterfaceValue	= getProgramInterfaceGLEnum(programInterface);
	const std::vector<std::string>	blockNames				= getProgramInterfaceResourceList(m_program, programInterface);
	glu::ShaderProgram				program					(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Verify all blocks
	for (int blockNdx = 0; blockNdx < (int)blockNames.size(); ++blockNdx)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "Block", "Block \"" + blockNames[blockNdx] + "\"");
		const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
		const glw::GLuint			resourceNdx			= gl.getProgramResourceIndex(program.getProgram(), programGLInterfaceValue, blockNames[blockNdx].c_str());
		const int					expectedMinDataSize	= getBlockMinDataSize(blockNames[blockNdx]);
		glw::GLint					queryDataSize		= -1;

		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (resourceNdx == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"" << blockNames[blockNdx] << "\"" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Resource not found");
			continue;
		}

		// query
		{
			const glw::GLenum prop = GL_BUFFER_DATA_SIZE;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, 1, &prop, 1, DE_NULL, &queryDataSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query resource BUFFER_DATA_SIZE");
		}

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "BUFFER_DATA_SIZE = " << queryDataSize << "\n"
			<< "Buffer data size with tight packing: " << expectedMinDataSize
			<< tcu::TestLog::EndMessage;

		if (queryDataSize < expectedMinDataSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, buffer size was less than minimum buffer data size" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer data size invalid");
			continue;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Buffer size valid" << tcu::TestLog::EndMessage;
	}

	return STOP;
}